

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

TX_TYPE av1_get_tx_type(MACROBLOCKD *xd,PLANE_TYPE plane_type,int blk_row,int blk_col,
                       TX_SIZE tx_size,int reduced_tx_set)

{
  MB_MODE_INFO *pMVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  uint is_inter;
  
  pMVar1 = *xd->mi;
  if ((xd->lossless[*(ushort *)&pMVar1->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0)) {
    if (plane_type == '\0') {
      bVar4 = xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
    }
    else {
      cVar3 = (char)*(ushort *)&pMVar1->field_0xa7;
      if ((cVar3 < '\0') || ('\0' < pMVar1->ref_frame[0])) {
        bVar4 = xd->tx_type_map
                [(blk_row << ((byte)xd->plane[plane_type].subsampling_y & 0x1f)) *
                 xd->tx_type_map_stride +
                 (blk_col << ((byte)xd->plane[plane_type].subsampling_x & 0x1f))];
        if (cVar3 < '\0') {
          is_inter = 1;
        }
        else {
          is_inter = (uint)('\0' < pMVar1->ref_frame[0]);
        }
      }
      else {
        bVar4 = intra_mode_to_tx_type__intra_mode_to_tx_type
                [(byte)get_uv_mode_uv2y[pMVar1->uv_mode]];
        is_inter = 0;
      }
      bVar2 = av1_get_ext_tx_set_type(tx_size,is_inter,reduced_tx_set);
      if (av1_ext_tx_used[bVar2][bVar4] == 0) {
        bVar4 = 0;
      }
    }
  }
  else {
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

static inline TX_TYPE av1_get_tx_type(const MACROBLOCKD *xd,
                                      PLANE_TYPE plane_type, int blk_row,
                                      int blk_col, TX_SIZE tx_size,
                                      int reduced_tx_set) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  if (xd->lossless[mbmi->segment_id] || txsize_sqr_up_map[tx_size] > TX_32X32) {
    return DCT_DCT;
  }

  TX_TYPE tx_type;
  if (plane_type == PLANE_TYPE_Y) {
    tx_type = xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
  } else {
    if (is_inter_block(mbmi)) {
      // scale back to y plane's coordinate
      const struct macroblockd_plane *const pd = &xd->plane[plane_type];
      blk_row <<= pd->subsampling_y;
      blk_col <<= pd->subsampling_x;
      tx_type = xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
    } else {
      // In intra mode, uv planes don't share the same prediction mode as y
      // plane, so the tx_type should not be shared
      tx_type = intra_mode_to_tx_type(mbmi, PLANE_TYPE_UV);
    }
    const TxSetType tx_set_type =
        av1_get_ext_tx_set_type(tx_size, is_inter_block(mbmi), reduced_tx_set);
    if (!av1_ext_tx_used[tx_set_type][tx_type]) tx_type = DCT_DCT;
  }
  assert(tx_type < TX_TYPES);
  assert(av1_ext_tx_used[av1_get_ext_tx_set_type(tx_size, is_inter_block(mbmi),
                                                 reduced_tx_set)][tx_type]);
  return tx_type;
}